

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_item_use_handling.hpp
# Opt level: O2

uint32_t PatchImproveItemUseHandling::inject_pre_use_table(ROM *rom,World *world)

{
  uint32_t uVar1;
  _Base_ptr p_Var2;
  allocator<char> local_b9;
  string local_b8;
  Code pre_use_table;
  
  pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  pre_use_table._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pre_use_table._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pre_use_table._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pre_use_table._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var2 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(world->_items)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    uVar1 = *(uint32_t *)&p_Var2[1]._M_parent[1]._M_right;
    if (uVar1 != 0) {
      md::Code::jmp(&pre_use_table,uVar1);
      md::Code::add_byte(&pre_use_table,*(uint8_t *)&(p_Var2[1]._M_parent)->_M_parent);
      md::Code::add_byte(&pre_use_table,0xff);
    }
  }
  md::Code::nop(&pre_use_table,3);
  md::Code::add_byte(&pre_use_table,0xff);
  md::Code::add_byte(&pre_use_table,0xff);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  uVar1 = md::ROM::inject_code(rom,&pre_use_table,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  md::Code::~Code(&pre_use_table);
  return uVar1;
}

Assistant:

static uint32_t inject_pre_use_table(md::ROM& rom, const World& world)
    {
        md::Code pre_use_table;
        for(auto& [id, item] : world.items())
        {
            if(!item->pre_use_address())
                continue;

            pre_use_table.jmp(item->pre_use_address());
            pre_use_table.add_byte(item->id());
            pre_use_table.add_byte(0xFF);
        }

        pre_use_table.nop(3);
        pre_use_table.add_byte(0xFF);
        pre_use_table.add_byte(0xFF);

        return rom.inject_code(pre_use_table);
    }